

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_format_specs<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
          (internal *this,null_terminating_iterator<char> it,
          specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
          *handler)

{
  uint *puVar1;
  internal iVar2;
  internal iVar3;
  basic_format_specs<char> *pbVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  internal *piVar8;
  basic_format_specs<char> *handler_00;
  bool bVar9;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  *this_00;
  alignment aVar10;
  char *message;
  long lVar11;
  basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>
  *this_01;
  internal *this_02;
  null_terminating_iterator<char> nVar12;
  null_terminating_iterator<char> nVar13;
  null_terminating_iterator<char> nVar14;
  null_terminating_iterator<char> local_38;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
  *local_28;
  
  this_00 = (specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
             *)it.end_;
  nVar14.ptr_ = (internal *)it.ptr_;
  if (this == nVar14.ptr_) goto LAB_0012e798;
  iVar2 = *this;
  handler_00 = (basic_format_specs<char> *)(ulong)(byte)iVar2;
  if ((iVar2 == (internal)0x0) || (iVar2 == (internal)0x7d)) goto LAB_0012e798;
  lVar11 = 1;
  bVar9 = false;
  bVar6 = true;
  do {
    bVar5 = bVar6;
    local_38.ptr_ = (char *)this;
    local_38.end_ = (char *)nVar14.ptr_;
    if (this + lVar11 != nVar14.ptr_) {
      iVar3 = this[lVar11];
      if ((byte)iVar3 < 0x3e) {
        if (iVar3 == (internal)0x3c) {
          aVar10 = ALIGN_LEFT;
          goto LAB_0012e80d;
        }
        if (iVar3 != (internal)0x3d) goto LAB_0012e7df;
        aVar10 = ALIGN_NUMERIC;
        bVar6 = true;
      }
      else {
        if (iVar3 == (internal)0x3e) {
          aVar10 = ALIGN_RIGHT;
        }
        else {
          if (iVar3 != (internal)0x5e) goto LAB_0012e7df;
          aVar10 = ALIGN_CENTER;
        }
LAB_0012e80d:
        bVar6 = false;
      }
      if (bVar9) {
        this = this + 1;
      }
      else {
        if (iVar2 == (internal)0x7b) {
          basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
                    ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)
                     (this_00->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     ).context_,"invalid fill character \'{\'");
          goto LAB_0012e798;
        }
        this = this + 2;
        handler_00 = (this_00->
                     super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                     ).super_specs_setter<char>.specs_;
        (handler_00->super_align_spec).fill_ = (int)(char)iVar2;
      }
      local_38.ptr_ = (char *)this;
      if (bVar6) {
        specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
        ::require_numeric_argument(this_00);
      }
      (((this_00->
        super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
        ).super_specs_setter<char>.specs_)->super_align_spec).align_ = aVar10;
      break;
    }
LAB_0012e7df:
    bVar9 = true;
    lVar11 = 0;
    bVar6 = false;
  } while (bVar5);
  if (this != nVar14.ptr_) {
    iVar2 = *this;
    if (iVar2 == (internal)0x20) {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
      ::check_sign(this_00);
      puVar1 = &((this_00->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_)->flags_;
      *puVar1 = *puVar1 | 1;
    }
    else if (iVar2 == (internal)0x2d) {
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
      ::check_sign(this_00);
      puVar1 = &((this_00->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_)->flags_;
      *puVar1 = *puVar1 | 4;
    }
    else {
      if (iVar2 != (internal)0x2b) goto LAB_0012e8a8;
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
      ::check_sign(this_00);
      puVar1 = &((this_00->
                 super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                 ).super_specs_setter<char>.specs_)->flags_;
      *puVar1 = *puVar1 | 3;
    }
    this = this + 1;
    local_38.ptr_ = (char *)this;
  }
LAB_0012e8a8:
  if ((this != nVar14.ptr_) && (*this == (internal)0x23)) {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::require_numeric_argument(this_00);
    puVar1 = &((this_00->
               super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               ).super_specs_setter<char>.specs_)->flags_;
    *puVar1 = *puVar1 | 8;
    this = this + 1;
    local_38.ptr_ = (char *)this;
  }
  if ((this != nVar14.ptr_) && (*this == (internal)0x30)) {
    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
    ::require_numeric_argument(this_00);
    pbVar4 = (this_00->
             super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
             ).super_specs_setter<char>.specs_;
    handler_00 = (basic_format_specs<char> *)0x400000030;
    (pbVar4->super_align_spec).fill_ = L'0';
    (pbVar4->super_align_spec).align_ = ALIGN_NUMERIC;
    this = this + 1;
    local_38.ptr_ = (char *)this;
  }
  if ((this == nVar14.ptr_) || (iVar2 = *this, (char)iVar2 < '0')) {
LAB_0012e95c:
    local_38.ptr_ = (char *)this;
    if (((internal *)local_38.ptr_ != nVar14.ptr_) && ((internal)*local_38.ptr_ == (internal)0x2e))
    {
      piVar8 = (internal *)local_38.ptr_ + 1;
      if ((piVar8 == nVar14.ptr_) || (iVar2 = *piVar8, (char)iVar2 < '0')) {
LAB_0012ea1e:
        this_01 = (this_00->
                  super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                  ).context_;
        message = "missing precision specifier";
        local_38.ptr_ = (char *)piVar8;
        goto LAB_0012ea29;
      }
      if ((byte)iVar2 < 0x3a) {
        local_38.ptr_ = (char *)piVar8;
        uVar7 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                          (&local_38,this_00);
        ((this_00->
         super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->precision_ = uVar7;
      }
      else {
        if (iVar2 != (internal)0x7b) goto LAB_0012ea1e;
        this_02 = (internal *)local_38.ptr_ + 2;
        nVar13.end_ = (char *)&local_28;
        nVar13.ptr_ = (char *)nVar14.ptr_;
        local_38.ptr_ = (char *)piVar8;
        local_28 = this_00;
        nVar14 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                           (this_02,nVar13,
                            (precision_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
                             *)handler_00);
        local_38.end_ = nVar14.end_;
        local_38.ptr_ = (char *)(nVar14.ptr_ + 1);
        if ((nVar14.ptr_ == (internal *)local_38.end_) || (*nVar14.ptr_ != (internal)0x7d))
        goto LAB_0012ea11;
      }
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
      ::end_precision(this_00);
      nVar14.ptr_ = (internal *)local_38.end_;
    }
    this = (internal *)local_38.ptr_;
    if ((((internal *)local_38.ptr_ != nVar14.ptr_) && ((internal)*local_38.ptr_ != (internal)0x0))
       && ((internal)*local_38.ptr_ != (internal)0x7d)) {
      this = (internal *)local_38.ptr_ + 1;
      ((this_00->
       super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
       ).super_specs_setter<char>.specs_)->type_ = *local_38.ptr_;
    }
  }
  else {
    if ((byte)iVar2 < 0x3a) {
      uVar7 = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&>
                        (&local_38,this_00);
      handler_00 = (this_00->
                   super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
                   ).super_specs_setter<char>.specs_;
      (handler_00->super_align_spec).width_ = uVar7;
      nVar14.ptr_ = (internal *)local_38.end_;
      this = (internal *)local_38.ptr_;
      goto LAB_0012e95c;
    }
    if (iVar2 != (internal)0x7b) goto LAB_0012e95c;
    nVar14.end_ = (char *)&local_28;
    local_28 = this_00;
    nVar13 = parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>>&,char>>
                       (this + 1,nVar14,
                        (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>_&,_char>
                         *)handler_00);
    nVar14.ptr_ = (internal *)nVar13.end_;
    piVar8 = (internal *)nVar13.ptr_;
    local_38.ptr_ = (char *)(piVar8 + 1);
    local_38.end_ = (char *)nVar14.ptr_;
    if ((piVar8 != nVar14.ptr_) && (this = (internal *)local_38.ptr_, *piVar8 == (internal)0x7d))
    goto LAB_0012e95c;
LAB_0012ea11:
    this_01 = (this_00->
              super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ).context_;
    message = "invalid format string";
LAB_0012ea29:
    basic_parse_context<char,_fmt::v5::internal::error_handler>::on_error
              ((basic_parse_context<char,_fmt::v5::internal::error_handler> *)this_01,message);
    nVar14.ptr_ = (internal *)local_38.end_;
    this = (internal *)local_38.ptr_;
  }
LAB_0012e798:
  nVar12.end_ = (char *)nVar14.ptr_;
  nVar12.ptr_ = (char *)this;
  return nVar12;
}

Assistant:

FMT_CONSTEXPR Iterator parse_format_specs(Iterator it, SpecHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || !c)
    return it;

  // Parse fill and alignment.
  alignment align = ALIGN_DEFAULT;
  int i = 1;
  do {
    auto p = it + i;
    switch (*p) {
      case '<':
        align = ALIGN_LEFT;
        break;
      case '>':
        align = ALIGN_RIGHT;
        break;
      case '=':
        align = ALIGN_NUMERIC;
        break;
      case '^':
        align = ALIGN_CENTER;
        break;
    }
    if (align != ALIGN_DEFAULT) {
      if (p != it) {
        if (c == '{') {
          handler.on_error("invalid fill character '{'");
          return it;
        }
        it += 2;
        handler.on_fill(c);
      } else ++it;
      handler.on_align(align);
      break;
    }
  } while (--i >= 0);

  // Parse sign.
  switch (*it) {
    case '+':
      handler.on_plus();
      ++it;
      break;
    case '-':
      handler.on_minus();
      ++it;
      break;
    case ' ':
      handler.on_space();
      ++it;
      break;
  }

  if (*it == '#') {
    handler.on_hash();
    ++it;
  }

  // Parse zero flag.
  if (*it == '0') {
    handler.on_zero();
    ++it;
  }

  // Parse width.
  if ('0' <= *it && *it <= '9') {
    handler.on_width(parse_nonnegative_int(it, handler));
  } else if (*it == '{') {
    it = parse_arg_id(it + 1, width_adapter<SpecHandler, char_type>(handler));
    if (*it++ != '}') {
      handler.on_error("invalid format string");
      return it;
    }
  }

  // Parse precision.
  if (*it == '.') {
    ++it;
    if ('0' <= *it && *it <= '9') {
      handler.on_precision(parse_nonnegative_int(it, handler));
    } else if (*it == '{') {
      it = parse_arg_id(
            it + 1, precision_adapter<SpecHandler, char_type>(handler));
      if (*it++ != '}') {
        handler.on_error("invalid format string");
        return it;
      }
    } else {
      handler.on_error("missing precision specifier");
      return it;
    }
    handler.end_precision();
  }

  // Parse type.
  if (*it != '}' && *it)
    handler.on_type(*it++);
  return it;
}